

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_26bbc3a::SumSquares1DTest_RandomValues_Test::TestBody
          (SumSquares1DTest_RandomValues_Test *this)

{
  uint uVar1;
  ACMRandom *this_00;
  undefined8 *puVar2;
  bool bVar3;
  uint32_t uVar4;
  pointer *__ptr;
  int iVar5;
  SEARCH_METHODS *message;
  int i;
  long lVar6;
  undefined2 in_FPUControlWord;
  undefined2 in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  RegisterStateCheckMMX reg_check_mmx;
  uint64_t tst_res;
  uint64_t ref_res;
  int16_t src [65536];
  Message MStack_20078;
  AssertHelper AStack_20070;
  internal aiStack_20068 [8];
  undefined2 uStack_20060;
  undefined2 uStack_2005e;
  undefined4 uStack_2005c;
  undefined2 uStack_20058;
  unsigned_long uStack_20048;
  unsigned_long uStack_20040;
  short asStack_20038 [65540];
  
  this_00 = &(this->super_SumSquares1DTest).
             super_FunctionEquivalenceTest<unsigned_long_(*)(const_short_*,_unsigned_int)>.rng_;
  iVar5 = 0;
  while( true ) {
    bVar3 = testing::Test::HasFatalFailure();
    if (bVar3) {
      return;
    }
    lVar6 = 0;
    do {
      uVar4 = testing::internal::Random::Generate(&this_00->random_,0x1fff);
      asStack_20038[lVar6] = (short)uVar4 + -0xfff;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x10000);
    uVar4 = testing::internal::Random::Generate(&this_00->random_,0xff);
    uVar1 = uVar4 * 0x40 + 0x40;
    uStack_20040 = (*(this->super_SumSquares1DTest).
                     super_FunctionEquivalenceTest<unsigned_long_(*)(const_short_*,_unsigned_int)>.
                     params_.ref_func)(asStack_20038,uVar1);
    aiStack_20068[0] = SUB21(in_FPUControlWord,0);
    uStack_2005c = (undefined4)in_FPUInstructionPointer;
    uStack_20058 = (undefined2)((ulong)in_FPUInstructionPointer >> 0x20);
    uStack_20060 = in_FPUTagWord;
    uStack_20048 = (*(this->super_SumSquares1DTest).
                     super_FunctionEquivalenceTest<unsigned_long_(*)(const_short_*,_unsigned_int)>.
                     params_.tst_func)(asStack_20038,uVar1);
    libaom_test::RegisterStateCheckMMX::Check((RegisterStateCheckMMX *)aiStack_20068);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (aiStack_20068,"ref_res","tst_res",&uStack_20040,&uStack_20048);
    if (aiStack_20068[0] == (internal)0x0) break;
    puVar2 = (undefined8 *)CONCAT44(uStack_2005c,CONCAT22(uStack_2005e,uStack_20060));
    if (puVar2 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar2 != puVar2 + 2) {
        operator_delete((undefined8 *)*puVar2);
      }
      operator_delete(puVar2);
    }
    iVar5 = iVar5 + 1;
    if (iVar5 == 1000) {
      return;
    }
  }
  testing::Message::Message(&MStack_20078);
  puVar2 = (undefined8 *)CONCAT44(uStack_2005c,CONCAT22(uStack_2005e,uStack_20060));
  if (puVar2 == (undefined8 *)0x0) {
    message = "";
  }
  else {
    message = (SEARCH_METHODS *)*puVar2;
  }
  testing::internal::AssertHelper::AssertHelper
            (&AStack_20070,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/sum_squares_test.cc"
             ,0xda,(char *)message);
  testing::internal::AssertHelper::operator=(&AStack_20070,&MStack_20078);
  testing::internal::AssertHelper::~AssertHelper(&AStack_20070);
  if (MStack_20078.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)MStack_20078.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  puVar2 = (undefined8 *)CONCAT44(uStack_2005c,CONCAT22(uStack_2005e,uStack_20060));
  if (puVar2 == (undefined8 *)0x0) {
    return;
  }
  if ((undefined8 *)*puVar2 != puVar2 + 2) {
    operator_delete((undefined8 *)*puVar2);
  }
  operator_delete(puVar2);
  return;
}

Assistant:

TEST_P(SumSquares1DTest, RandomValues) {
  DECLARE_ALIGNED(16, int16_t, src[kMaxSize * kMaxSize]);

  for (int iter = 0; iter < kIterations && !HasFatalFailure(); ++iter) {
    for (int i = 0; i < kMaxSize * kMaxSize; ++i)
      src[i] = rng_(kInt13Max * 2 + 1) - kInt13Max;

    // Block size is between 64 and 128 * 128 and is always a multiple of 64.
    const int n = (rng_(255) + 1) * 64;

    const uint64_t ref_res = params_.ref_func(src, n);
    uint64_t tst_res;
    API_REGISTER_STATE_CHECK(tst_res = params_.tst_func(src, n));

    ASSERT_EQ(ref_res, tst_res);
  }
}